

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::utp_socket_impl::maybe_trigger_writeable_callback
          (utp_socket_impl *this,error_code *ec)

{
  error_code *peVar1;
  error_code error_to_report;
  error_code local_18;
  
  if ((this->m_writeable_handler != false) && ((this->field_0x21d & 0x40) == 0)) {
    this->m_writeable_handler = false;
    peVar1 = &this->m_error;
    if (ec->failed_ != false) {
      peVar1 = ec;
    }
    local_18.val_ = peVar1->val_;
    local_18.failed_ = peVar1->failed_;
    local_18._5_3_ = *(undefined3 *)&peVar1->field_0x5;
    local_18.cat_ = peVar1->cat_;
    utp_stream::on_writeable(this->m_userdata,&local_18);
  }
  return;
}

Assistant:

void utp_socket_impl::maybe_trigger_writeable_callback(error_code const& ec)
{
	INVARIANT_CHECK;

	if (m_writeable_handler == false) return;

	if (m_stalled) return;

	m_writeable_handler = false;
	error_code const error_to_report = ec ? ec : m_error;
	utp_stream::on_writeable(m_userdata, error_to_report);
}